

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

CharCount __thiscall
UnifiedRegex::MatchLiteralNode::EmitScan
          (MatchLiteralNode *this,Compiler *compiler,bool isHeadSyncronizingNode)

{
  Char CVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  uint8 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined7 in_register_00000011;
  Char *pat;
  undefined1 local_60 [8];
  TextbookBoyerMooreSetup<char16_t> setup;
  
  pat = (compiler->program->rep).insts.litbuf.ptr + this->offset;
  bVar4 = (this->super_Node).prevConsumes.upper != 0;
  bVar3 = (this->super_Node).prevConsumes.lower != 0;
  setup._0_8_ = pat;
  if ((int)CONCAT71(in_register_00000011,isHeadSyncronizingNode) != 0) {
    if (bVar4 || bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x3e1,"(prevConsumes.IsExact(0))","prevConsumes.IsExact(0)");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    setup.pat._0_4_ = this->length;
    if (this->isEquivClass == true) {
      CVar1 = pat[(CharCount)setup.pat * 4 - 4];
      if (((CVar1 == pat[(CharCount)setup.pat * 4 - 3]) &&
          (CVar1 == pat[(CharCount)setup.pat * 4 - 2])) &&
         (CVar1 == pat[(CharCount)setup.pat * 4 - 1])) {
        puVar6 = Compiler::Emit(compiler,0x449);
        uVar7._0_4_ = this->offset;
        uVar7._4_4_ = this->length;
        *puVar6 = '6';
      }
      else {
        puVar6 = Compiler::Emit(compiler,0x449);
        uVar7._0_4_ = this->offset;
        uVar7._4_4_ = this->length;
        *puVar6 = '5';
      }
      *(undefined8 *)(puVar6 + 1) = uVar7;
      *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(puVar6 + 0x21) = (undefined1  [16])0x0;
      puVar6[0x31] = 0xff;
      puVar6[0x32] = 0xff;
      puVar6[0x33] = 0xff;
      puVar6[0x34] = 0xff;
      puVar6[0x439] = '\0';
      puVar6[0x43a] = '\0';
      puVar6[0x43b] = '\0';
      puVar6[0x43c] = '\0';
      puVar6[0x43d] = '\0';
      puVar6[0x43e] = '\0';
      puVar6[0x43f] = '\0';
      puVar6[0x440] = '\0';
      memset(puVar6 + 0x35,0xff,0x400);
      puVar6[0x441] = '\0';
      puVar6[0x442] = '\0';
      puVar6[0x443] = '\0';
      puVar6[0x444] = '\0';
      puVar6[0x445] = '\0';
      puVar6[0x446] = '\0';
      puVar6[0x447] = '\0';
      puVar6[0x448] = '\0';
      TextbookBoyerMoore<char16_t>::Setup
                ((TextbookBoyerMoore<char16_t> *)(puVar6 + 9),compiler->rtAllocator,pat,this->length
                 ,4);
    }
    else if ((CharCount)setup.pat == 2) {
      puVar6 = Compiler::Emit(compiler,5);
      uVar10 = *(undefined4 *)pat;
      *puVar6 = '2';
      *(undefined4 *)(puVar6 + 1) = uVar10;
    }
    else if ((CharCount)setup.pat == 1) {
      puVar6 = Compiler::Emit(compiler,3);
      CVar1 = *pat;
      *puVar6 = '.';
      *(Char *)(puVar6 + 1) = CVar1;
    }
    else {
      TextbookBoyerMooreSetup<char16_t>::Init((TextbookBoyerMooreSetup<char16_t> *)local_60);
      if (local_60._0_4_ == DefaultScheme) {
        puVar6 = Compiler::Emit(compiler,0x449);
        uVar7 = *(undefined8 *)&this->offset;
        *puVar6 = '3';
        *(undefined8 *)(puVar6 + 1) = uVar7;
        *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(puVar6 + 0x21) = (undefined1  [16])0x0;
        puVar6[0x31] = 0xff;
        puVar6[0x32] = 0xff;
        puVar6[0x33] = 0xff;
        puVar6[0x34] = 0xff;
        puVar6[0x439] = '\0';
        puVar6[0x43a] = '\0';
        puVar6[0x43b] = '\0';
        puVar6[0x43c] = '\0';
        puVar6[0x43d] = '\0';
        puVar6[0x43e] = '\0';
        puVar6[0x43f] = '\0';
        puVar6[0x440] = '\0';
        memset(puVar6 + 0x35,0xff,0x400);
        puVar6[0x441] = '\0';
        puVar6[0x442] = '\0';
        puVar6[0x443] = '\0';
        puVar6[0x444] = '\0';
        puVar6[0x445] = '\0';
        puVar6[0x446] = '\0';
        puVar6[0x447] = '\0';
        puVar6[0x448] = '\0';
        TextbookBoyerMoore<char16_t>::Setup
                  ((TextbookBoyerMoore<char16_t> *)(puVar6 + 9),compiler->rtAllocator,
                   (TextbookBoyerMooreSetup<char16_t> *)local_60);
      }
      else if (local_60._0_4_ == LinearScheme) {
        puVar6 = Compiler::Emit(compiler,0x39);
        uVar7 = *(undefined8 *)&this->offset;
        *puVar6 = '4';
        *(undefined8 *)(puVar6 + 1) = uVar7;
        puVar6[0xd] = 0xff;
        puVar6[0xe] = 0xff;
        puVar6[0xf] = 0xff;
        puVar6[0x10] = 0xff;
        *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
        puVar6[0x21] = 0xff;
        puVar6[0x22] = 0xff;
        puVar6[0x23] = 0xff;
        puVar6[0x24] = 0xff;
        puVar6[0x25] = 0xff;
        puVar6[0x26] = 0xff;
        puVar6[0x27] = 0xff;
        puVar6[0x28] = 0xff;
        puVar6[0x29] = 0xff;
        puVar6[0x2a] = 0xff;
        puVar6[0x2b] = 0xff;
        puVar6[0x2c] = 0xff;
        puVar6[0x2d] = 0xff;
        puVar6[0x2e] = 0xff;
        puVar6[0x2f] = 0xff;
        puVar6[0x30] = 0xff;
        puVar6[0x31] = '\0';
        puVar6[0x32] = '\0';
        puVar6[0x33] = '\0';
        puVar6[0x34] = '\0';
        puVar6[0x35] = '\0';
        puVar6[0x36] = '\0';
        puVar6[0x37] = '\0';
        puVar6[0x38] = '\0';
        TextbookBoyerMooreWithLinearMap<char16_t>::Setup
                  ((TextbookBoyerMooreWithLinearMap<char16_t> *)(puVar6 + 9),compiler->rtAllocator,
                   (TextbookBoyerMooreSetup<char16_t> *)local_60);
      }
    }
    return this->length;
  }
  setup.pat._0_4_ = this->length;
  if (bVar4 || bVar3) {
    if (this->isEquivClass != false) {
      CVar1 = pat[(CharCount)setup.pat * 4 - 4];
      if (((CVar1 == pat[(CharCount)setup.pat * 4 - 3]) &&
          (CVar1 == pat[(CharCount)setup.pat * 4 - 2])) &&
         (CVar1 == pat[(CharCount)setup.pat * 4 - 1])) {
        puVar6 = Compiler::Emit(compiler,0x451);
        uVar9._0_4_ = this->offset;
        uVar9._4_4_ = this->length;
        *puVar6 = '>';
      }
      else {
        puVar6 = Compiler::Emit(compiler,0x451);
        uVar9._0_4_ = this->offset;
        uVar9._4_4_ = this->length;
        *puVar6 = '=';
      }
      *(undefined8 *)(puVar6 + 1) = uVar9;
      *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(puVar6 + 0x21) = (undefined1  [16])0x0;
      puVar6[0x31] = 0xff;
      puVar6[0x32] = 0xff;
      puVar6[0x33] = 0xff;
      puVar6[0x34] = 0xff;
      puVar6[0x439] = '\0';
      puVar6[0x43a] = '\0';
      puVar6[0x43b] = '\0';
      puVar6[0x43c] = '\0';
      puVar6[0x43d] = '\0';
      puVar6[0x43e] = '\0';
      puVar6[0x43f] = '\0';
      puVar6[0x440] = '\0';
      memset(puVar6 + 0x35,0xff,0x400);
      puVar6[0x441] = '\0';
      puVar6[0x442] = '\0';
      puVar6[0x443] = '\0';
      puVar6[0x444] = '\0';
      puVar6[0x445] = '\0';
      puVar6[0x446] = '\0';
      puVar6[0x447] = '\0';
      puVar6[0x448] = '\0';
      *(CountDomain *)(puVar6 + 0x449) = (this->super_Node).prevConsumes;
      goto LAB_00eabf97;
    }
    if ((CharCount)setup.pat == 2) {
      puVar6 = Compiler::Emit(compiler,0xd);
      uVar10 = *(undefined4 *)pat;
      *puVar6 = ':';
      puVar6[1] = '\0';
      puVar6[2] = '\0';
      puVar6[3] = '\0';
      puVar6[4] = '\0';
      *(CountDomain *)(puVar6 + 5) = (this->super_Node).prevConsumes;
      goto LAB_00eac084;
    }
    if ((CharCount)setup.pat == 1) {
      puVar6 = Compiler::Emit(compiler,0xb);
      CVar1 = *pat;
      *puVar6 = '7';
      *(Char *)(puVar6 + 1) = CVar1;
      *(CountDomain *)(puVar6 + 3) = (this->super_Node).prevConsumes;
      return 0;
    }
    TextbookBoyerMooreSetup<char16_t>::Init((TextbookBoyerMooreSetup<char16_t> *)local_60);
    if (local_60._0_4_ == DefaultScheme) {
      puVar6 = Compiler::Emit(compiler,0x451);
      uVar7 = *(undefined8 *)&this->offset;
      *puVar6 = ';';
      *(undefined8 *)(puVar6 + 1) = uVar7;
      *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(puVar6 + 0x21) = (undefined1  [16])0x0;
      puVar6[0x31] = 0xff;
      puVar6[0x32] = 0xff;
      puVar6[0x33] = 0xff;
      puVar6[0x34] = 0xff;
      puVar6[0x439] = '\0';
      puVar6[0x43a] = '\0';
      puVar6[0x43b] = '\0';
      puVar6[0x43c] = '\0';
      puVar6[0x43d] = '\0';
      puVar6[0x43e] = '\0';
      puVar6[0x43f] = '\0';
      puVar6[0x440] = '\0';
      memset(puVar6 + 0x35,0xff,0x400);
      puVar6[0x441] = '\0';
      puVar6[0x442] = '\0';
      puVar6[0x443] = '\0';
      puVar6[0x444] = '\0';
      puVar6[0x445] = '\0';
      puVar6[0x446] = '\0';
      puVar6[0x447] = '\0';
      puVar6[0x448] = '\0';
      *(CountDomain *)(puVar6 + 0x449) = (this->super_Node).prevConsumes;
      goto LAB_00eac2a5;
    }
    if (local_60._0_4_ != LinearScheme) {
      return 0;
    }
    puVar6 = Compiler::Emit(compiler,0x41);
    uVar7 = *(undefined8 *)&this->offset;
    *puVar6 = '<';
    *(undefined8 *)(puVar6 + 1) = uVar7;
    puVar6[0xd] = 0xff;
    puVar6[0xe] = 0xff;
    puVar6[0xf] = 0xff;
    puVar6[0x10] = 0xff;
    *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
    puVar6[0x21] = 0xff;
    puVar6[0x22] = 0xff;
    puVar6[0x23] = 0xff;
    puVar6[0x24] = 0xff;
    puVar6[0x25] = 0xff;
    puVar6[0x26] = 0xff;
    puVar6[0x27] = 0xff;
    puVar6[0x28] = 0xff;
    puVar6[0x29] = 0xff;
    puVar6[0x2a] = 0xff;
    puVar6[0x2b] = 0xff;
    puVar6[0x2c] = 0xff;
    puVar6[0x2d] = 0xff;
    puVar6[0x2e] = 0xff;
    puVar6[0x2f] = 0xff;
    puVar6[0x30] = 0xff;
    puVar6[0x31] = '\0';
    puVar6[0x32] = '\0';
    puVar6[0x33] = '\0';
    puVar6[0x34] = '\0';
    puVar6[0x35] = '\0';
    puVar6[0x36] = '\0';
    puVar6[0x37] = '\0';
    puVar6[0x38] = '\0';
    *(CountDomain *)(puVar6 + 0x39) = (this->super_Node).prevConsumes;
  }
  else {
    if (this->isEquivClass != false) {
      CVar1 = pat[(CharCount)setup.pat * 4 - 4];
      if (((CVar1 == pat[(CharCount)setup.pat * 4 - 3]) &&
          (CVar1 == pat[(CharCount)setup.pat * 4 - 2])) &&
         (CVar1 == pat[(CharCount)setup.pat * 4 - 1])) {
        puVar6 = Compiler::Emit(compiler,0x449);
        uVar8._0_4_ = this->offset;
        uVar8._4_4_ = this->length;
        *puVar6 = '-';
      }
      else {
        puVar6 = Compiler::Emit(compiler,0x449);
        uVar8._0_4_ = this->offset;
        uVar8._4_4_ = this->length;
        *puVar6 = ',';
      }
      *(undefined8 *)(puVar6 + 1) = uVar8;
      *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(puVar6 + 0x21) = (undefined1  [16])0x0;
      puVar6[0x31] = 0xff;
      puVar6[0x32] = 0xff;
      puVar6[0x33] = 0xff;
      puVar6[0x34] = 0xff;
      puVar6[0x439] = '\0';
      puVar6[0x43a] = '\0';
      puVar6[0x43b] = '\0';
      puVar6[0x43c] = '\0';
      puVar6[0x43d] = '\0';
      puVar6[0x43e] = '\0';
      puVar6[0x43f] = '\0';
      puVar6[0x440] = '\0';
      memset(puVar6 + 0x35,0xff,0x400);
      puVar6[0x441] = '\0';
      puVar6[0x442] = '\0';
      puVar6[0x443] = '\0';
      puVar6[0x444] = '\0';
      puVar6[0x445] = '\0';
      puVar6[0x446] = '\0';
      puVar6[0x447] = '\0';
      puVar6[0x448] = '\0';
LAB_00eabf97:
      TextbookBoyerMoore<char16_t>::Setup
                ((TextbookBoyerMoore<char16_t> *)(puVar6 + 9),compiler->rtAllocator,pat,this->length
                 ,4);
      return 0;
    }
    if ((CharCount)setup.pat == 2) {
      puVar6 = Compiler::Emit(compiler,5);
      uVar10 = *(undefined4 *)pat;
      *puVar6 = ')';
LAB_00eac084:
      *(undefined4 *)(puVar6 + 1) = uVar10;
      return 0;
    }
    if ((CharCount)setup.pat == 1) {
      puVar6 = Compiler::Emit(compiler,3);
      CVar1 = *pat;
      *puVar6 = '%';
      *(Char *)(puVar6 + 1) = CVar1;
      return 0;
    }
    TextbookBoyerMooreSetup<char16_t>::Init((TextbookBoyerMooreSetup<char16_t> *)local_60);
    if (local_60._0_4_ == DefaultScheme) {
      puVar6 = Compiler::Emit(compiler,0x449);
      uVar7 = *(undefined8 *)&this->offset;
      *puVar6 = '*';
      *(undefined8 *)(puVar6 + 1) = uVar7;
      *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(puVar6 + 0x21) = (undefined1  [16])0x0;
      puVar6[0x31] = 0xff;
      puVar6[0x32] = 0xff;
      puVar6[0x33] = 0xff;
      puVar6[0x34] = 0xff;
      puVar6[0x439] = '\0';
      puVar6[0x43a] = '\0';
      puVar6[0x43b] = '\0';
      puVar6[0x43c] = '\0';
      puVar6[0x43d] = '\0';
      puVar6[0x43e] = '\0';
      puVar6[0x43f] = '\0';
      puVar6[0x440] = '\0';
      memset(puVar6 + 0x35,0xff,0x400);
      puVar6[0x441] = '\0';
      puVar6[0x442] = '\0';
      puVar6[0x443] = '\0';
      puVar6[0x444] = '\0';
      puVar6[0x445] = '\0';
      puVar6[0x446] = '\0';
      puVar6[0x447] = '\0';
      puVar6[0x448] = '\0';
LAB_00eac2a5:
      TextbookBoyerMoore<char16_t>::Setup
                ((TextbookBoyerMoore<char16_t> *)(puVar6 + 9),compiler->rtAllocator,
                 (TextbookBoyerMooreSetup<char16_t> *)local_60);
      return 0;
    }
    if (local_60._0_4_ != LinearScheme) {
      return 0;
    }
    puVar6 = Compiler::Emit(compiler,0x39);
    uVar7 = *(undefined8 *)&this->offset;
    *puVar6 = '+';
    *(undefined8 *)(puVar6 + 1) = uVar7;
    puVar6[0xd] = 0xff;
    puVar6[0xe] = 0xff;
    puVar6[0xf] = 0xff;
    puVar6[0x10] = 0xff;
    *(undefined1 (*) [16])(puVar6 + 0x11) = (undefined1  [16])0x0;
    puVar6[0x21] = 0xff;
    puVar6[0x22] = 0xff;
    puVar6[0x23] = 0xff;
    puVar6[0x24] = 0xff;
    puVar6[0x25] = 0xff;
    puVar6[0x26] = 0xff;
    puVar6[0x27] = 0xff;
    puVar6[0x28] = 0xff;
    puVar6[0x29] = 0xff;
    puVar6[0x2a] = 0xff;
    puVar6[0x2b] = 0xff;
    puVar6[0x2c] = 0xff;
    puVar6[0x2d] = 0xff;
    puVar6[0x2e] = 0xff;
    puVar6[0x2f] = 0xff;
    puVar6[0x30] = 0xff;
    puVar6[0x31] = '\0';
    puVar6[0x32] = '\0';
    puVar6[0x33] = '\0';
    puVar6[0x34] = '\0';
    puVar6[0x35] = '\0';
    puVar6[0x36] = '\0';
    puVar6[0x37] = '\0';
    puVar6[0x38] = '\0';
  }
  TextbookBoyerMooreWithLinearMap<char16_t>::Setup
            ((TextbookBoyerMooreWithLinearMap<char16_t> *)(puVar6 + 9),compiler->rtAllocator,
             (TextbookBoyerMooreSetup<char16_t> *)local_60);
  return 0;
}

Assistant:

CharCount MatchLiteralNode::EmitScan(Compiler& compiler, bool isHeadSyncronizingNode)
    {
        //
        // Compilation scheme:
        //
        //   SyncTo(Literal|LiteralEquiv|LinearLiteral)And(Continue|Consume|Backup)
        //

        Char * litptr = compiler.program->rep.insts.litbuf + offset;

        if (isHeadSyncronizingNode)
        {
            // For a head literal there's no need to back up after finding the literal, so use a faster instruction
            Assert(prevConsumes.IsExact(0)); // there should not be any consumes before this node
            if (isEquivClass)
            {
                const uint lastPatCharIndex = length - 1;
                if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                    && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                    && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                {
                    EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                }
                else
                {
                    EMIT(compiler, SyncToLiteralEquivAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                }
            }
            else if (length == 1)
                EMIT(compiler, SyncToCharAndConsumeInst, litptr[0]);
            else if (length == 2)
                EMIT(compiler, SyncToChar2LiteralAndConsumeInst, litptr[0], litptr[1]);
            else
            {
                TextbookBoyerMooreSetup<char16> setup(litptr, length);
                switch (setup.GetScheme())
                {
                case TextbookBoyerMooreSetup<char16>::LinearScheme:
                    EMIT(compiler, SyncToLinearLiteralAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                    break;
                case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                    EMIT(compiler, SyncToLiteralAndConsumeInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                    break;
                };
            }
            return length;
        }
        else
        {
            // We're synchronizing on a non-head literal so we may need to back up. Or if we're syncing to the first literal
            // inside a group for instance, then we won't need to back up but we cannot consume the literal.
            if (prevConsumes.IsExact(0))
            {
                if (isEquivClass)
                {
                    const uint lastPatCharIndex = length - 1;
                    if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                    {
                        EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                    else
                    {
                        EMIT(compiler, SyncToLiteralEquivAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                }
                else if (length == 1)
                    EMIT(compiler, SyncToCharAndContinueInst, litptr[0]);
                else if (length == 2)
                    EMIT(compiler, SyncToChar2LiteralAndContinueInst, litptr[0], litptr[1]);
                else
                {
                    TextbookBoyerMooreSetup<char16> setup(litptr, length);
                    switch (setup.GetScheme())
                    {
                    case TextbookBoyerMooreSetup<char16>::LinearScheme:
                        EMIT(compiler, SyncToLinearLiteralAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                        EMIT(compiler, SyncToLiteralAndContinueInst, offset, length)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    };
                }
            }
            else
            {
                if (isEquivClass)
                {
                    const uint lastPatCharIndex = length - 1;
                    if (litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 1]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 2]
                        && litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize] == litptr[lastPatCharIndex * CaseInsensitive::EquivClassSize + 3])
                    {
                        EMIT(compiler, SyncToLiteralEquivTrivialLastPatCharAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                    else
                    {
                        EMIT(compiler, SyncToLiteralEquivAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, litptr, length, CaseInsensitive::EquivClassSize);
                    }
                }
                else if (length == 1)
                    EMIT(compiler, SyncToCharAndBackupInst, litptr[0], prevConsumes);
                else if (length == 2)
                    EMIT(compiler, SyncToChar2LiteralAndBackupInst, litptr[0], litptr[1], prevConsumes);
                else
                {
                    TextbookBoyerMooreSetup<char16> setup(litptr, length);
                    switch (setup.GetScheme())
                    {
                    case TextbookBoyerMooreSetup<char16>::LinearScheme:
                        EMIT(compiler, SyncToLinearLiteralAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    case TextbookBoyerMooreSetup<char16>::DefaultScheme:
                        EMIT(compiler, SyncToLiteralAndBackupInst, offset, length, prevConsumes)->scanner.Setup(compiler.rtAllocator, setup);
                        break;
                    };
                }
            }
            return 0;
        }
    }